

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-simd.c
# Opt level: O3

uint32_t blockmix_salsa8_xor(salsa20_blk_t *Bin1,salsa20_blk_t *Bin2,salsa20_blk_t *Bout,size_t r)

{
  int *piVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  uint32_t *puVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  __m128i Y0;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar21;
  uint uVar30;
  uint uVar31;
  __m128i Y1;
  uint uVar32;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  __m128i Y3;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int iVar45;
  int iVar58;
  int iVar59;
  __m128i Y2;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar60;
  undefined1 auVar57 [16];
  uint uVar72;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  uint uVar73;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  uint uVar74;
  uint uVar87;
  uint uVar88;
  uint uVar89;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  __m128i Y0_1;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  uint uVar140;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  uint uVar141;
  uint uVar142;
  uint uVar160;
  uint uVar161;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  uint uVar162;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  uint uVar163;
  uint uVar164;
  uint uVar165;
  uint uVar166;
  int iVar167;
  int iVar168;
  int iVar169;
  int iVar170;
  
  lVar10 = r - 1;
  lVar8 = lVar10 * 0x80;
  lVar9 = lVar10 * 2;
  lVar7 = lVar10 * 2;
  for (; lVar10 != 0; lVar10 = lVar10 + -1) {
  }
  uVar163 = Bin2[lVar9 + 1].w[0] ^ Bin1[lVar7 + 1].w[0];
  uVar164 = *(uint *)((long)Bin2 + lVar8 + 0x44) ^ *(uint *)((long)Bin1 + lVar8 + 0x44);
  uVar165 = *(uint *)((long)Bin2 + lVar8 + 0x48) ^ *(uint *)((long)Bin1 + lVar8 + 0x48);
  uVar166 = *(uint *)((long)Bin2 + lVar8 + 0x4c) ^ *(uint *)((long)Bin1 + lVar8 + 0x4c);
  uVar30 = *(uint *)((long)Bin2 + lVar8 + 0x50) ^ *(uint *)((long)Bin1 + lVar8 + 0x50);
  uVar31 = *(uint *)((long)Bin2 + lVar8 + 0x54) ^ *(uint *)((long)Bin1 + lVar8 + 0x54);
  uVar32 = *(uint *)((long)Bin2 + lVar8 + 0x58) ^ *(uint *)((long)Bin1 + lVar8 + 0x58);
  uVar21 = *(uint *)((long)Bin2 + lVar8 + 0x5c) ^ *(uint *)((long)Bin1 + lVar8 + 0x5c);
  auVar46 = *(undefined1 (*) [16])((long)Bin2 + lVar8 + 0x60) ^
            *(undefined1 (*) [16])((long)Bin1 + lVar8 + 0x60);
  auVar33 = *(undefined1 (*) [16])((long)Bin2 + lVar8 + 0x70) ^
            *(undefined1 (*) [16])((long)Bin1 + lVar8 + 0x70);
  lVar10 = r + (r == 0);
  lVar9 = 0x30;
  do {
    puVar2 = (uint *)((long)Bin1 + lVar9 * 2 + -0x50);
    puVar3 = (uint *)((long)Bin1 + lVar9 * 2 + -0x60);
    puVar4 = (uint *)((long)Bin2 + lVar9 * 2 + -0x60);
    uVar163 = uVar163 ^ *puVar3 ^ *puVar4;
    uVar164 = uVar164 ^ puVar3[1] ^ puVar4[1];
    uVar165 = uVar165 ^ puVar3[2] ^ puVar4[2];
    uVar166 = uVar166 ^ puVar3[3] ^ puVar4[3];
    puVar3 = (uint *)((long)Bin2 + lVar9 * 2 + -0x50);
    uVar30 = uVar30 ^ *puVar2 ^ *puVar3;
    uVar31 = uVar31 ^ puVar2[1] ^ puVar3[1];
    uVar32 = uVar32 ^ puVar2[2] ^ puVar3[2];
    uVar21 = uVar21 ^ puVar2[3] ^ puVar3[3];
    auVar46 = auVar46 ^ *(undefined1 (*) [16])((long)Bin1 + lVar9 * 2 + -0x40) ^
              *(undefined1 (*) [16])((long)Bin2 + lVar9 * 2 + -0x40);
    auVar33 = auVar33 ^ *(undefined1 (*) [16])((long)Bin1 + lVar9 * 2 + -0x30) ^
              *(undefined1 (*) [16])((long)Bin2 + lVar9 * 2 + -0x30);
    uVar74 = auVar33._0_4_ + uVar163;
    uVar87 = auVar33._4_4_ + uVar164;
    uVar88 = auVar33._8_4_ + uVar165;
    uVar89 = auVar33._12_4_ + uVar166;
    uVar142 = (uVar74 * 0x80 | uVar74 >> 0x19) ^ uVar30;
    uVar160 = (uVar87 * 0x80 | uVar87 >> 0x19) ^ uVar31;
    uVar161 = (uVar88 * 0x80 | uVar88 >> 0x19) ^ uVar32;
    uVar162 = (uVar89 * 0x80 | uVar89 >> 0x19) ^ uVar21;
    auVar61._0_4_ = uVar142 + uVar163 >> 0x17;
    auVar61._4_4_ = uVar160 + uVar164 >> 0x17;
    auVar61._8_4_ = uVar161 + uVar165 >> 0x17;
    auVar61._12_4_ = uVar162 + uVar166 >> 0x17;
    auVar90._0_4_ = (uVar142 + uVar163) * 0x200;
    auVar90._4_4_ = (uVar160 + uVar164) * 0x200;
    auVar90._8_4_ = (uVar161 + uVar165) * 0x200;
    auVar90._12_4_ = (uVar162 + uVar166) * 0x200;
    auVar91 = (auVar90 | auVar61) ^ auVar46;
    iVar168 = auVar91._0_4_;
    iVar169 = auVar91._4_4_;
    uVar74 = auVar91._8_4_ + uVar161;
    uVar87 = auVar91._12_4_ + uVar162;
    auVar100._0_4_ = iVar168 + uVar142 >> 0x13;
    auVar100._4_4_ = iVar169 + uVar160 >> 0x13;
    auVar100._8_4_ = uVar74 >> 0x13;
    auVar100._12_4_ = uVar87 >> 0x13;
    auVar62._0_4_ = (iVar168 + uVar142) * 0x2000;
    auVar62._4_4_ = (iVar169 + uVar160) * 0x2000;
    auVar62._8_4_ = uVar74 * 0x2000;
    auVar62._12_4_ = uVar87 * 0x2000;
    auVar63 = (auVar62 | auVar100) ^ auVar33;
    auVar101._0_12_ = auVar63._4_12_;
    auVar101._12_4_ = auVar63._0_4_;
    uVar74 = auVar63._0_4_ + iVar168;
    uVar88 = auVar63._4_4_ + iVar169;
    uVar72 = auVar63._8_4_ + auVar91._8_4_;
    uVar73 = auVar63._12_4_ + auVar91._12_4_;
    uVar87 = (uVar74 * 0x40000 | uVar74 >> 0xe) ^ uVar163;
    uVar89 = (uVar88 * 0x40000 | uVar88 >> 0xe) ^ uVar164;
    uVar140 = (uVar72 * 0x40000 | uVar72 >> 0xe) ^ uVar165;
    uVar141 = (uVar73 * 0x40000 | uVar73 >> 0xe) ^ uVar166;
    auVar77._4_4_ = uVar142;
    auVar77._0_4_ = uVar162;
    auVar77._8_4_ = uVar160;
    auVar77._12_4_ = uVar161;
    auVar75._0_8_ = auVar91._8_8_;
    auVar75._8_4_ = iVar168;
    auVar75._12_4_ = iVar169;
    auVar143._0_4_ = (uVar162 + uVar87) * 0x80;
    auVar143._4_4_ = (uVar142 + uVar89) * 0x80;
    auVar143._8_4_ = (uVar160 + uVar140) * 0x80;
    auVar143._12_4_ = (uVar161 + uVar141) * 0x80;
    auVar92._0_4_ = uVar162 + uVar87 >> 0x19;
    auVar92._4_4_ = uVar142 + uVar89 >> 0x19;
    auVar92._8_4_ = uVar160 + uVar140 >> 0x19;
    auVar92._12_4_ = uVar161 + uVar141 >> 0x19;
    auVar92 = auVar92 ^ auVar143 ^ auVar101;
    iVar170 = auVar92._0_4_;
    iVar167 = auVar92._4_4_;
    iVar45 = auVar92._8_4_;
    iVar58 = auVar92._12_4_;
    auVar144._0_4_ = (iVar170 + uVar87) * 0x200;
    auVar144._4_4_ = (iVar167 + uVar89) * 0x200;
    auVar144._8_4_ = (iVar45 + uVar140) * 0x200;
    auVar144._12_4_ = (iVar58 + uVar141) * 0x200;
    auVar102._0_4_ = iVar170 + uVar87 >> 0x17;
    auVar102._4_4_ = iVar167 + uVar89 >> 0x17;
    auVar102._8_4_ = iVar45 + uVar140 >> 0x17;
    auVar102._12_4_ = iVar58 + uVar141 >> 0x17;
    auVar102 = auVar102 ^ auVar144 ^ auVar75;
    iVar168 = auVar102._0_4_;
    iVar169 = auVar102._4_4_;
    uVar74 = auVar102._8_4_ + iVar45;
    uVar88 = auVar102._12_4_ + iVar58;
    auVar145._0_4_ = (uint)(iVar168 + iVar170) >> 0x13;
    auVar145._4_4_ = (uint)(iVar169 + iVar167) >> 0x13;
    auVar145._8_4_ = uVar74 >> 0x13;
    auVar145._12_4_ = uVar88 >> 0x13;
    auVar76._0_4_ = (iVar168 + iVar170) * 0x2000;
    auVar76._4_4_ = (iVar169 + iVar167) * 0x2000;
    auVar76._8_4_ = uVar74 * 0x2000;
    auVar76._12_4_ = uVar88 * 0x2000;
    auVar77 = (auVar76 | auVar145) ^ auVar77;
    auVar113._0_12_ = auVar77._4_12_;
    auVar113._12_4_ = auVar77._0_4_;
    uVar74 = auVar77._0_4_ + iVar168;
    uVar88 = auVar77._4_4_ + iVar169;
    uVar72 = auVar77._8_4_ + auVar102._8_4_;
    uVar73 = auVar77._12_4_ + auVar102._12_4_;
    uVar87 = (uVar74 * 0x40000 | uVar74 >> 0xe) ^ uVar87;
    uVar89 = (uVar88 * 0x40000 | uVar88 >> 0xe) ^ uVar89;
    uVar140 = (uVar72 * 0x40000 | uVar72 >> 0xe) ^ uVar140;
    uVar141 = (uVar73 * 0x40000 | uVar73 >> 0xe) ^ uVar141;
    auVar64._0_8_ = auVar102._8_8_;
    auVar64._8_4_ = iVar168;
    auVar64._12_4_ = iVar169;
    auVar66._4_4_ = iVar170;
    auVar66._0_4_ = iVar58;
    auVar66._8_4_ = iVar167;
    auVar66._12_4_ = iVar45;
    auVar146._0_4_ = (iVar58 + uVar87) * 0x80;
    auVar146._4_4_ = (iVar170 + uVar89) * 0x80;
    auVar146._8_4_ = (iVar167 + uVar140) * 0x80;
    auVar146._12_4_ = (iVar45 + uVar141) * 0x80;
    auVar93._0_4_ = iVar58 + uVar87 >> 0x19;
    auVar93._4_4_ = iVar170 + uVar89 >> 0x19;
    auVar93._8_4_ = iVar167 + uVar140 >> 0x19;
    auVar93._12_4_ = iVar45 + uVar141 >> 0x19;
    auVar93 = auVar93 ^ auVar146 ^ auVar113;
    iVar170 = auVar93._0_4_;
    iVar167 = auVar93._4_4_;
    iVar45 = auVar93._8_4_;
    iVar58 = auVar93._12_4_;
    auVar147._0_4_ = (iVar170 + uVar87) * 0x200;
    auVar147._4_4_ = (iVar167 + uVar89) * 0x200;
    auVar147._8_4_ = (iVar45 + uVar140) * 0x200;
    auVar147._12_4_ = (iVar58 + uVar141) * 0x200;
    auVar114._0_4_ = iVar170 + uVar87 >> 0x17;
    auVar114._4_4_ = iVar167 + uVar89 >> 0x17;
    auVar114._8_4_ = iVar45 + uVar140 >> 0x17;
    auVar114._12_4_ = iVar58 + uVar141 >> 0x17;
    auVar114 = auVar114 ^ auVar147 ^ auVar64;
    iVar168 = auVar114._0_4_;
    iVar169 = auVar114._4_4_;
    uVar74 = auVar114._8_4_ + iVar45;
    uVar88 = auVar114._12_4_ + iVar58;
    auVar148._0_4_ = (uint)(iVar168 + iVar170) >> 0x13;
    auVar148._4_4_ = (uint)(iVar169 + iVar167) >> 0x13;
    auVar148._8_4_ = uVar74 >> 0x13;
    auVar148._12_4_ = uVar88 >> 0x13;
    auVar65._0_4_ = (iVar168 + iVar170) * 0x2000;
    auVar65._4_4_ = (iVar169 + iVar167) * 0x2000;
    auVar65._8_4_ = uVar74 * 0x2000;
    auVar65._12_4_ = uVar88 * 0x2000;
    auVar66 = (auVar65 | auVar148) ^ auVar66;
    auVar103._0_12_ = auVar66._4_12_;
    auVar103._12_4_ = auVar66._0_4_;
    uVar74 = auVar66._0_4_ + iVar168;
    uVar88 = auVar66._4_4_ + iVar169;
    uVar72 = auVar66._8_4_ + auVar114._8_4_;
    uVar73 = auVar66._12_4_ + auVar114._12_4_;
    uVar87 = (uVar74 * 0x40000 | uVar74 >> 0xe) ^ uVar87;
    uVar89 = (uVar88 * 0x40000 | uVar88 >> 0xe) ^ uVar89;
    uVar140 = (uVar72 * 0x40000 | uVar72 >> 0xe) ^ uVar140;
    uVar141 = (uVar73 * 0x40000 | uVar73 >> 0xe) ^ uVar141;
    auVar80._4_4_ = iVar170;
    auVar80._0_4_ = iVar58;
    auVar80._8_4_ = iVar167;
    auVar80._12_4_ = iVar45;
    auVar78._0_8_ = auVar114._8_8_;
    auVar78._8_4_ = iVar168;
    auVar78._12_4_ = iVar169;
    auVar115._0_4_ = (iVar58 + uVar87) * 0x80;
    auVar115._4_4_ = (iVar170 + uVar89) * 0x80;
    auVar115._8_4_ = (iVar167 + uVar140) * 0x80;
    auVar115._12_4_ = (iVar45 + uVar141) * 0x80;
    auVar94._0_4_ = iVar58 + uVar87 >> 0x19;
    auVar94._4_4_ = iVar170 + uVar89 >> 0x19;
    auVar94._8_4_ = iVar167 + uVar140 >> 0x19;
    auVar94._12_4_ = iVar45 + uVar141 >> 0x19;
    auVar94 = auVar94 ^ auVar115 ^ auVar103;
    iVar170 = auVar94._0_4_;
    iVar167 = auVar94._4_4_;
    iVar45 = auVar94._8_4_;
    iVar58 = auVar94._12_4_;
    auVar116._0_4_ = (iVar170 + uVar87) * 0x200;
    auVar116._4_4_ = (iVar167 + uVar89) * 0x200;
    auVar116._8_4_ = (iVar45 + uVar140) * 0x200;
    auVar116._12_4_ = (iVar58 + uVar141) * 0x200;
    auVar104._0_4_ = iVar170 + uVar87 >> 0x17;
    auVar104._4_4_ = iVar167 + uVar89 >> 0x17;
    auVar104._8_4_ = iVar45 + uVar140 >> 0x17;
    auVar104._12_4_ = iVar58 + uVar141 >> 0x17;
    auVar104 = auVar104 ^ auVar116 ^ auVar78;
    iVar168 = auVar104._0_4_;
    iVar169 = auVar104._4_4_;
    uVar74 = auVar104._8_4_ + iVar45;
    uVar88 = auVar104._12_4_ + iVar58;
    auVar117._0_4_ = (uint)(iVar168 + iVar170) >> 0x13;
    auVar117._4_4_ = (uint)(iVar169 + iVar167) >> 0x13;
    auVar117._8_4_ = uVar74 >> 0x13;
    auVar117._12_4_ = uVar88 >> 0x13;
    auVar79._0_4_ = (iVar168 + iVar170) * 0x2000;
    auVar79._4_4_ = (iVar169 + iVar167) * 0x2000;
    auVar79._8_4_ = uVar74 * 0x2000;
    auVar79._12_4_ = uVar88 * 0x2000;
    auVar80 = (auVar79 | auVar117) ^ auVar80;
    auVar118._0_12_ = auVar80._4_12_;
    auVar118._12_4_ = auVar80._0_4_;
    uVar74 = auVar80._0_4_ + iVar168;
    uVar88 = auVar80._4_4_ + iVar169;
    uVar72 = auVar80._8_4_ + auVar104._8_4_;
    uVar73 = auVar80._12_4_ + auVar104._12_4_;
    uVar87 = (uVar74 * 0x40000 | uVar74 >> 0xe) ^ uVar87;
    uVar89 = (uVar88 * 0x40000 | uVar88 >> 0xe) ^ uVar89;
    uVar140 = (uVar72 * 0x40000 | uVar72 >> 0xe) ^ uVar140;
    uVar141 = (uVar73 * 0x40000 | uVar73 >> 0xe) ^ uVar141;
    auVar105._0_8_ = auVar104._8_8_;
    auVar105._8_4_ = iVar168;
    auVar105._12_4_ = iVar169;
    auVar98._4_4_ = iVar170;
    auVar98._0_4_ = iVar58;
    auVar98._8_4_ = iVar167;
    auVar98._12_4_ = iVar45;
    auVar95._0_4_ = (iVar58 + uVar87) * 0x80;
    auVar95._4_4_ = (iVar170 + uVar89) * 0x80;
    auVar95._8_4_ = (iVar167 + uVar140) * 0x80;
    auVar95._12_4_ = (iVar45 + uVar141) * 0x80;
    auVar67._0_4_ = iVar58 + uVar87 >> 0x19;
    auVar67._4_4_ = iVar170 + uVar89 >> 0x19;
    auVar67._8_4_ = iVar167 + uVar140 >> 0x19;
    auVar67._12_4_ = iVar45 + uVar141 >> 0x19;
    auVar67 = auVar67 ^ auVar95 ^ auVar118;
    iVar170 = auVar67._0_4_;
    iVar167 = auVar67._4_4_;
    iVar45 = auVar67._8_4_;
    iVar58 = auVar67._12_4_;
    auVar96._0_4_ = (iVar170 + uVar87) * 0x200;
    auVar96._4_4_ = (iVar167 + uVar89) * 0x200;
    auVar96._8_4_ = (iVar45 + uVar140) * 0x200;
    auVar96._12_4_ = (iVar58 + uVar141) * 0x200;
    auVar119._0_4_ = iVar170 + uVar87 >> 0x17;
    auVar119._4_4_ = iVar167 + uVar89 >> 0x17;
    auVar119._8_4_ = iVar45 + uVar140 >> 0x17;
    auVar119._12_4_ = iVar58 + uVar141 >> 0x17;
    auVar119 = auVar119 ^ auVar96 ^ auVar105;
    iVar168 = auVar119._0_4_;
    iVar169 = auVar119._4_4_;
    uVar74 = auVar119._8_4_ + iVar45;
    uVar88 = auVar119._12_4_ + iVar58;
    auVar106._0_4_ = (uint)(iVar168 + iVar170) >> 0x13;
    auVar106._4_4_ = (uint)(iVar169 + iVar167) >> 0x13;
    auVar106._8_4_ = uVar74 >> 0x13;
    auVar106._12_4_ = uVar88 >> 0x13;
    auVar97._0_4_ = (iVar168 + iVar170) * 0x2000;
    auVar97._4_4_ = (iVar169 + iVar167) * 0x2000;
    auVar97._8_4_ = uVar74 * 0x2000;
    auVar97._12_4_ = uVar88 * 0x2000;
    auVar98 = (auVar97 | auVar106) ^ auVar98;
    auVar107._0_12_ = auVar98._4_12_;
    auVar107._12_4_ = auVar98._0_4_;
    uVar74 = auVar98._0_4_ + iVar168;
    uVar88 = auVar98._4_4_ + iVar169;
    uVar72 = auVar98._8_4_ + auVar119._8_4_;
    uVar73 = auVar98._12_4_ + auVar119._12_4_;
    uVar87 = (uVar74 * 0x40000 | uVar74 >> 0xe) ^ uVar87;
    uVar89 = (uVar88 * 0x40000 | uVar88 >> 0xe) ^ uVar89;
    uVar140 = (uVar72 * 0x40000 | uVar72 >> 0xe) ^ uVar140;
    uVar141 = (uVar73 * 0x40000 | uVar73 >> 0xe) ^ uVar141;
    auVar70._4_4_ = iVar170;
    auVar70._0_4_ = iVar58;
    auVar70._8_4_ = iVar167;
    auVar70._12_4_ = iVar45;
    auVar68._0_8_ = auVar119._8_8_;
    auVar68._8_4_ = iVar168;
    auVar68._12_4_ = iVar169;
    auVar120._0_4_ = (iVar58 + uVar87) * 0x80;
    auVar120._4_4_ = (iVar170 + uVar89) * 0x80;
    auVar120._8_4_ = (iVar167 + uVar140) * 0x80;
    auVar120._12_4_ = (iVar45 + uVar141) * 0x80;
    auVar81._0_4_ = iVar58 + uVar87 >> 0x19;
    auVar81._4_4_ = iVar170 + uVar89 >> 0x19;
    auVar81._8_4_ = iVar167 + uVar140 >> 0x19;
    auVar81._12_4_ = iVar45 + uVar141 >> 0x19;
    auVar81 = auVar81 ^ auVar120 ^ auVar107;
    iVar170 = auVar81._0_4_;
    iVar167 = auVar81._4_4_;
    iVar45 = auVar81._8_4_;
    iVar58 = auVar81._12_4_;
    auVar121._0_4_ = (iVar170 + uVar87) * 0x200;
    auVar121._4_4_ = (iVar167 + uVar89) * 0x200;
    auVar121._8_4_ = (iVar45 + uVar140) * 0x200;
    auVar121._12_4_ = (iVar58 + uVar141) * 0x200;
    auVar108._0_4_ = iVar170 + uVar87 >> 0x17;
    auVar108._4_4_ = iVar167 + uVar89 >> 0x17;
    auVar108._8_4_ = iVar45 + uVar140 >> 0x17;
    auVar108._12_4_ = iVar58 + uVar141 >> 0x17;
    auVar108 = auVar108 ^ auVar121 ^ auVar68;
    iVar168 = auVar108._0_4_;
    iVar169 = auVar108._4_4_;
    uVar74 = auVar108._8_4_ + iVar45;
    uVar88 = auVar108._12_4_ + iVar58;
    auVar122._0_4_ = (uint)(iVar168 + iVar170) >> 0x13;
    auVar122._4_4_ = (uint)(iVar169 + iVar167) >> 0x13;
    auVar122._8_4_ = uVar74 >> 0x13;
    auVar122._12_4_ = uVar88 >> 0x13;
    auVar69._0_4_ = (iVar168 + iVar170) * 0x2000;
    auVar69._4_4_ = (iVar169 + iVar167) * 0x2000;
    auVar69._8_4_ = uVar74 * 0x2000;
    auVar69._12_4_ = uVar88 * 0x2000;
    auVar70 = (auVar69 | auVar122) ^ auVar70;
    auVar123._0_12_ = auVar70._4_12_;
    auVar123._12_4_ = auVar70._0_4_;
    uVar74 = auVar70._0_4_ + iVar168;
    uVar88 = auVar70._4_4_ + iVar169;
    uVar72 = auVar70._8_4_ + auVar108._8_4_;
    uVar73 = auVar70._12_4_ + auVar108._12_4_;
    uVar87 = (uVar74 * 0x40000 | uVar74 >> 0xe) ^ uVar87;
    uVar89 = (uVar88 * 0x40000 | uVar88 >> 0xe) ^ uVar89;
    uVar140 = (uVar72 * 0x40000 | uVar72 >> 0xe) ^ uVar140;
    uVar141 = (uVar73 * 0x40000 | uVar73 >> 0xe) ^ uVar141;
    auVar109._0_8_ = auVar108._8_8_;
    auVar109._8_4_ = iVar168;
    auVar109._12_4_ = iVar169;
    auVar85._4_4_ = iVar170;
    auVar85._0_4_ = iVar58;
    auVar85._8_4_ = iVar167;
    auVar85._12_4_ = iVar45;
    auVar82._0_4_ = (iVar58 + uVar87) * 0x80;
    auVar82._4_4_ = (iVar170 + uVar89) * 0x80;
    auVar82._8_4_ = (iVar167 + uVar140) * 0x80;
    auVar82._12_4_ = (iVar45 + uVar141) * 0x80;
    auVar99._0_4_ = iVar58 + uVar87 >> 0x19;
    auVar99._4_4_ = iVar170 + uVar89 >> 0x19;
    auVar99._8_4_ = iVar167 + uVar140 >> 0x19;
    auVar99._12_4_ = iVar45 + uVar141 >> 0x19;
    auVar99 = auVar99 ^ auVar82 ^ auVar123;
    uVar142 = auVar99._0_4_;
    uVar160 = auVar99._4_4_;
    uVar161 = auVar99._8_4_;
    uVar162 = auVar99._12_4_;
    auVar83._0_4_ = (uVar142 + uVar87) * 0x200;
    auVar83._4_4_ = (uVar160 + uVar89) * 0x200;
    auVar83._8_4_ = (uVar161 + uVar140) * 0x200;
    auVar83._12_4_ = (uVar162 + uVar141) * 0x200;
    auVar124._0_4_ = uVar142 + uVar87 >> 0x17;
    auVar124._4_4_ = uVar160 + uVar89 >> 0x17;
    auVar124._8_4_ = uVar161 + uVar140 >> 0x17;
    auVar124._12_4_ = uVar162 + uVar141 >> 0x17;
    auVar124 = auVar124 ^ auVar83 ^ auVar109;
    iVar168 = auVar124._0_4_;
    iVar169 = auVar124._4_4_;
    uVar74 = auVar124._8_4_ + uVar161;
    uVar88 = auVar124._12_4_ + uVar162;
    auVar110._0_4_ = iVar168 + uVar142 >> 0x13;
    auVar110._4_4_ = iVar169 + uVar160 >> 0x13;
    auVar110._8_4_ = uVar74 >> 0x13;
    auVar110._12_4_ = uVar88 >> 0x13;
    auVar84._0_4_ = (iVar168 + uVar142) * 0x2000;
    auVar84._4_4_ = (iVar169 + uVar160) * 0x2000;
    auVar84._8_4_ = uVar74 * 0x2000;
    auVar84._12_4_ = uVar88 * 0x2000;
    auVar85 = (auVar84 | auVar110) ^ auVar85;
    auVar111._0_12_ = auVar85._4_12_;
    auVar111._12_4_ = auVar85._0_4_;
    uVar74 = auVar85._0_4_ + iVar168;
    uVar88 = auVar85._4_4_ + iVar169;
    uVar72 = auVar85._8_4_ + auVar124._8_4_;
    uVar73 = auVar85._12_4_ + auVar124._12_4_;
    auVar125._0_8_ = auVar124._8_8_;
    auVar125._8_4_ = iVar168;
    auVar125._12_4_ = iVar169;
    uVar87 = (uVar74 * 0x40000 | uVar74 >> 0xe) ^ uVar87;
    uVar89 = (uVar88 * 0x40000 | uVar88 >> 0xe) ^ uVar89;
    uVar140 = (uVar72 * 0x40000 | uVar72 >> 0xe) ^ uVar140;
    uVar141 = (uVar73 * 0x40000 | uVar73 >> 0xe) ^ uVar141;
    auVar149._0_4_ = (uVar162 + uVar87) * 0x80;
    auVar149._4_4_ = (uVar142 + uVar89) * 0x80;
    auVar149._8_4_ = (uVar160 + uVar140) * 0x80;
    auVar149._12_4_ = (uVar161 + uVar141) * 0x80;
    auVar71._0_4_ = uVar162 + uVar87 >> 0x19;
    auVar71._4_4_ = uVar142 + uVar89 >> 0x19;
    auVar71._8_4_ = uVar160 + uVar140 >> 0x19;
    auVar71._12_4_ = uVar161 + uVar141 >> 0x19;
    auVar71 = auVar71 ^ auVar149 ^ auVar111;
    iVar168 = auVar71._0_4_;
    iVar169 = auVar71._4_4_;
    iVar170 = auVar71._8_4_;
    iVar167 = auVar71._12_4_;
    auVar150._0_4_ = (iVar168 + uVar87) * 0x200;
    auVar150._4_4_ = (iVar169 + uVar89) * 0x200;
    auVar150._8_4_ = (iVar170 + uVar140) * 0x200;
    auVar150._12_4_ = (iVar167 + uVar141) * 0x200;
    auVar112._0_4_ = iVar168 + uVar87 >> 0x17;
    auVar112._4_4_ = iVar169 + uVar89 >> 0x17;
    auVar112._8_4_ = iVar170 + uVar140 >> 0x17;
    auVar112._12_4_ = iVar167 + uVar141 >> 0x17;
    auVar112 = auVar112 ^ auVar150 ^ auVar125;
    iVar45 = auVar112._0_4_;
    iVar58 = auVar112._4_4_;
    iVar59 = auVar112._8_4_;
    iVar60 = auVar112._12_4_;
    uVar162 = ((iVar45 + iVar168) * 0x2000 | (uint)(iVar45 + iVar168) >> 0x13) ^ uVar162;
    uVar142 = ((iVar58 + iVar169) * 0x2000 | (uint)(iVar58 + iVar169) >> 0x13) ^ uVar142;
    uVar160 = ((iVar59 + iVar170) * 0x2000 | (uint)(iVar59 + iVar170) >> 0x13) ^ uVar160;
    uVar161 = ((iVar60 + iVar167) * 0x2000 | (uint)(iVar60 + iVar167) >> 0x13) ^ uVar161;
    uVar74 = uVar162 + iVar45;
    uVar88 = uVar142 + iVar58;
    uVar72 = uVar160 + iVar59;
    uVar73 = uVar161 + iVar60;
    uVar163 = ((uVar74 * 0x40000 | uVar74 >> 0xe) ^ uVar87) + uVar163;
    uVar164 = ((uVar88 * 0x40000 | uVar88 >> 0xe) ^ uVar89) + uVar164;
    uVar165 = ((uVar72 * 0x40000 | uVar72 >> 0xe) ^ uVar140) + uVar165;
    uVar166 = ((uVar73 * 0x40000 | uVar73 >> 0xe) ^ uVar141) + uVar166;
    puVar2 = (uint *)((long)Bout + lVar9 + -0x30);
    *puVar2 = uVar163;
    puVar2[1] = uVar164;
    puVar2[2] = uVar165;
    puVar2[3] = uVar166;
    uVar142 = uVar142 + uVar30;
    uVar160 = uVar160 + uVar31;
    uVar161 = uVar161 + uVar32;
    uVar162 = uVar162 + uVar21;
    puVar2 = (uint *)((long)Bout + lVar9 + -0x20);
    *puVar2 = uVar142;
    puVar2[1] = uVar160;
    puVar2[2] = uVar161;
    puVar2[3] = uVar162;
    auVar86._0_4_ = iVar59 + auVar46._0_4_;
    auVar86._4_4_ = iVar60 + auVar46._4_4_;
    auVar86._8_4_ = iVar45 + auVar46._8_4_;
    auVar86._12_4_ = iVar58 + auVar46._12_4_;
    *(undefined1 (*) [16])((long)Bout + lVar9 + -0x10) = auVar86;
    iVar167 = iVar167 + auVar33._0_4_;
    iVar168 = iVar168 + auVar33._4_4_;
    iVar169 = iVar169 + auVar33._8_4_;
    iVar170 = iVar170 + auVar33._12_4_;
    piVar1 = (int *)((long)Bout + lVar9);
    *piVar1 = iVar167;
    piVar1[1] = iVar168;
    piVar1[2] = iVar169;
    piVar1[3] = iVar170;
    puVar2 = (uint *)((long)Bin2 + lVar9 * 2 + -0x20);
    puVar3 = (uint *)((long)Bin2 + lVar9 * 2 + -0x10);
    puVar4 = (uint *)((long)Bin1 + lVar9 * 2 + -0x20);
    puVar5 = (uint *)((long)Bin1 + lVar9 * 2 + -0x10);
    uVar163 = *puVar2 ^ *puVar4 ^ uVar163;
    uVar164 = puVar2[1] ^ puVar4[1] ^ uVar164;
    uVar165 = puVar2[2] ^ puVar4[2] ^ uVar165;
    uVar166 = puVar2[3] ^ puVar4[3] ^ uVar166;
    auVar63._4_4_ = iVar168;
    auVar63._0_4_ = iVar167;
    auVar63._8_4_ = iVar169;
    auVar63._12_4_ = iVar170;
    auVar63 = *(undefined1 (*) [16])((long)Bin2 + lVar9 * 2 + 0x10) ^
              *(undefined1 (*) [16])((long)Bin1 + lVar9 * 2 + 0x10) ^ auVar63;
    uVar21 = auVar63._0_4_ + uVar163;
    uVar30 = auVar63._4_4_ + uVar164;
    uVar31 = auVar63._8_4_ + uVar165;
    uVar32 = auVar63._12_4_ + uVar166;
    uVar142 = *puVar3 ^ *puVar5 ^ uVar142;
    uVar160 = puVar3[1] ^ puVar5[1] ^ uVar160;
    uVar161 = puVar3[2] ^ puVar5[2] ^ uVar161;
    uVar162 = puVar3[3] ^ puVar5[3] ^ uVar162;
    uVar87 = (uVar21 * 0x80 | uVar21 >> 0x19) ^ uVar142;
    uVar89 = (uVar30 * 0x80 | uVar30 >> 0x19) ^ uVar160;
    uVar140 = (uVar31 * 0x80 | uVar31 >> 0x19) ^ uVar161;
    uVar141 = (uVar32 * 0x80 | uVar32 >> 0x19) ^ uVar162;
    auVar91._0_4_ = uVar87 + uVar163 >> 0x17;
    auVar91._4_4_ = uVar89 + uVar164 >> 0x17;
    auVar91._8_4_ = uVar140 + uVar165 >> 0x17;
    auVar91._12_4_ = uVar141 + uVar166 >> 0x17;
    auVar34._0_4_ = (uVar87 + uVar163) * 0x200;
    auVar34._4_4_ = (uVar89 + uVar164) * 0x200;
    auVar34._8_4_ = (uVar140 + uVar165) * 0x200;
    auVar34._12_4_ = (uVar141 + uVar166) * 0x200;
    auVar86 = *(undefined1 (*) [16])((long)Bin2 + lVar9 * 2) ^
              *(undefined1 (*) [16])((long)Bin1 + lVar9 * 2) ^ auVar86;
    auVar46 = (auVar34 | auVar91) ^ auVar86;
    iVar168 = auVar46._0_4_;
    iVar169 = auVar46._4_4_;
    uVar21 = auVar46._8_4_ + uVar140;
    uVar30 = auVar46._12_4_ + uVar141;
    auVar47._0_4_ = iVar168 + uVar87 >> 0x13;
    auVar47._4_4_ = iVar169 + uVar89 >> 0x13;
    auVar47._8_4_ = uVar21 >> 0x13;
    auVar47._12_4_ = uVar30 >> 0x13;
    auVar11._0_4_ = (iVar168 + uVar87) * 0x2000;
    auVar11._4_4_ = (iVar169 + uVar89) * 0x2000;
    auVar11._8_4_ = uVar21 * 0x2000;
    auVar11._12_4_ = uVar30 * 0x2000;
    auVar33 = (auVar11 | auVar47) ^ auVar63;
    auVar48._0_12_ = auVar33._4_12_;
    auVar48._12_4_ = auVar33._0_4_;
    uVar21 = auVar33._0_4_ + iVar168;
    uVar30 = auVar33._4_4_ + iVar169;
    uVar31 = auVar33._8_4_ + auVar46._8_4_;
    uVar32 = auVar33._12_4_ + auVar46._12_4_;
    uVar74 = (uVar21 * 0x40000 | uVar21 >> 0xe) ^ uVar163;
    uVar88 = (uVar30 * 0x40000 | uVar30 >> 0xe) ^ uVar164;
    uVar72 = (uVar31 * 0x40000 | uVar31 >> 0xe) ^ uVar165;
    uVar73 = (uVar32 * 0x40000 | uVar32 >> 0xe) ^ uVar166;
    auVar24._4_4_ = uVar87;
    auVar24._0_4_ = uVar141;
    auVar24._8_4_ = uVar89;
    auVar24._12_4_ = uVar140;
    auVar22._0_8_ = auVar46._8_8_;
    auVar22._8_4_ = iVar168;
    auVar22._12_4_ = iVar169;
    auVar151._0_4_ = (uVar141 + uVar74) * 0x80;
    auVar151._4_4_ = (uVar87 + uVar88) * 0x80;
    auVar151._8_4_ = (uVar89 + uVar72) * 0x80;
    auVar151._12_4_ = (uVar140 + uVar73) * 0x80;
    auVar35._0_4_ = uVar141 + uVar74 >> 0x19;
    auVar35._4_4_ = uVar87 + uVar88 >> 0x19;
    auVar35._8_4_ = uVar89 + uVar72 >> 0x19;
    auVar35._12_4_ = uVar140 + uVar73 >> 0x19;
    auVar35 = auVar35 ^ auVar151 ^ auVar48;
    iVar170 = auVar35._0_4_;
    iVar167 = auVar35._4_4_;
    iVar45 = auVar35._8_4_;
    iVar58 = auVar35._12_4_;
    auVar152._0_4_ = (iVar170 + uVar74) * 0x200;
    auVar152._4_4_ = (iVar167 + uVar88) * 0x200;
    auVar152._8_4_ = (iVar45 + uVar72) * 0x200;
    auVar152._12_4_ = (iVar58 + uVar73) * 0x200;
    auVar49._0_4_ = iVar170 + uVar74 >> 0x17;
    auVar49._4_4_ = iVar167 + uVar88 >> 0x17;
    auVar49._8_4_ = iVar45 + uVar72 >> 0x17;
    auVar49._12_4_ = iVar58 + uVar73 >> 0x17;
    auVar49 = auVar49 ^ auVar152 ^ auVar22;
    iVar168 = auVar49._0_4_;
    iVar169 = auVar49._4_4_;
    uVar21 = auVar49._8_4_ + iVar45;
    uVar30 = auVar49._12_4_ + iVar58;
    auVar153._0_4_ = (uint)(iVar168 + iVar170) >> 0x13;
    auVar153._4_4_ = (uint)(iVar169 + iVar167) >> 0x13;
    auVar153._8_4_ = uVar21 >> 0x13;
    auVar153._12_4_ = uVar30 >> 0x13;
    auVar23._0_4_ = (iVar168 + iVar170) * 0x2000;
    auVar23._4_4_ = (iVar169 + iVar167) * 0x2000;
    auVar23._8_4_ = uVar21 * 0x2000;
    auVar23._12_4_ = uVar30 * 0x2000;
    auVar24 = (auVar23 | auVar153) ^ auVar24;
    auVar126._0_12_ = auVar24._4_12_;
    auVar126._12_4_ = auVar24._0_4_;
    uVar21 = auVar24._0_4_ + iVar168;
    uVar30 = auVar24._4_4_ + iVar169;
    uVar31 = auVar24._8_4_ + auVar49._8_4_;
    uVar32 = auVar24._12_4_ + auVar49._12_4_;
    uVar74 = (uVar21 * 0x40000 | uVar21 >> 0xe) ^ uVar74;
    uVar88 = (uVar30 * 0x40000 | uVar30 >> 0xe) ^ uVar88;
    uVar72 = (uVar31 * 0x40000 | uVar31 >> 0xe) ^ uVar72;
    uVar73 = (uVar32 * 0x40000 | uVar32 >> 0xe) ^ uVar73;
    auVar12._0_8_ = auVar49._8_8_;
    auVar12._8_4_ = iVar168;
    auVar12._12_4_ = iVar169;
    auVar14._4_4_ = iVar170;
    auVar14._0_4_ = iVar58;
    auVar14._8_4_ = iVar167;
    auVar14._12_4_ = iVar45;
    auVar154._0_4_ = (iVar58 + uVar74) * 0x80;
    auVar154._4_4_ = (iVar170 + uVar88) * 0x80;
    auVar154._8_4_ = (iVar167 + uVar72) * 0x80;
    auVar154._12_4_ = (iVar45 + uVar73) * 0x80;
    auVar36._0_4_ = iVar58 + uVar74 >> 0x19;
    auVar36._4_4_ = iVar170 + uVar88 >> 0x19;
    auVar36._8_4_ = iVar167 + uVar72 >> 0x19;
    auVar36._12_4_ = iVar45 + uVar73 >> 0x19;
    auVar36 = auVar36 ^ auVar154 ^ auVar126;
    iVar170 = auVar36._0_4_;
    iVar167 = auVar36._4_4_;
    iVar45 = auVar36._8_4_;
    iVar58 = auVar36._12_4_;
    auVar155._0_4_ = (iVar170 + uVar74) * 0x200;
    auVar155._4_4_ = (iVar167 + uVar88) * 0x200;
    auVar155._8_4_ = (iVar45 + uVar72) * 0x200;
    auVar155._12_4_ = (iVar58 + uVar73) * 0x200;
    auVar127._0_4_ = iVar170 + uVar74 >> 0x17;
    auVar127._4_4_ = iVar167 + uVar88 >> 0x17;
    auVar127._8_4_ = iVar45 + uVar72 >> 0x17;
    auVar127._12_4_ = iVar58 + uVar73 >> 0x17;
    auVar127 = auVar127 ^ auVar155 ^ auVar12;
    iVar168 = auVar127._0_4_;
    iVar169 = auVar127._4_4_;
    uVar21 = auVar127._8_4_ + iVar45;
    uVar30 = auVar127._12_4_ + iVar58;
    auVar156._0_4_ = (uint)(iVar168 + iVar170) >> 0x13;
    auVar156._4_4_ = (uint)(iVar169 + iVar167) >> 0x13;
    auVar156._8_4_ = uVar21 >> 0x13;
    auVar156._12_4_ = uVar30 >> 0x13;
    auVar13._0_4_ = (iVar168 + iVar170) * 0x2000;
    auVar13._4_4_ = (iVar169 + iVar167) * 0x2000;
    auVar13._8_4_ = uVar21 * 0x2000;
    auVar13._12_4_ = uVar30 * 0x2000;
    auVar14 = (auVar13 | auVar156) ^ auVar14;
    auVar50._0_12_ = auVar14._4_12_;
    auVar50._12_4_ = auVar14._0_4_;
    uVar21 = auVar14._0_4_ + iVar168;
    uVar30 = auVar14._4_4_ + iVar169;
    uVar31 = auVar14._8_4_ + auVar127._8_4_;
    uVar32 = auVar14._12_4_ + auVar127._12_4_;
    uVar74 = (uVar21 * 0x40000 | uVar21 >> 0xe) ^ uVar74;
    uVar88 = (uVar30 * 0x40000 | uVar30 >> 0xe) ^ uVar88;
    uVar72 = (uVar31 * 0x40000 | uVar31 >> 0xe) ^ uVar72;
    uVar73 = (uVar32 * 0x40000 | uVar32 >> 0xe) ^ uVar73;
    auVar27._4_4_ = iVar170;
    auVar27._0_4_ = iVar58;
    auVar27._8_4_ = iVar167;
    auVar27._12_4_ = iVar45;
    auVar25._0_8_ = auVar127._8_8_;
    auVar25._8_4_ = iVar168;
    auVar25._12_4_ = iVar169;
    auVar128._0_4_ = (iVar58 + uVar74) * 0x80;
    auVar128._4_4_ = (iVar170 + uVar88) * 0x80;
    auVar128._8_4_ = (iVar167 + uVar72) * 0x80;
    auVar128._12_4_ = (iVar45 + uVar73) * 0x80;
    auVar37._0_4_ = iVar58 + uVar74 >> 0x19;
    auVar37._4_4_ = iVar170 + uVar88 >> 0x19;
    auVar37._8_4_ = iVar167 + uVar72 >> 0x19;
    auVar37._12_4_ = iVar45 + uVar73 >> 0x19;
    auVar37 = auVar37 ^ auVar128 ^ auVar50;
    iVar170 = auVar37._0_4_;
    iVar167 = auVar37._4_4_;
    iVar45 = auVar37._8_4_;
    iVar58 = auVar37._12_4_;
    auVar129._0_4_ = (iVar170 + uVar74) * 0x200;
    auVar129._4_4_ = (iVar167 + uVar88) * 0x200;
    auVar129._8_4_ = (iVar45 + uVar72) * 0x200;
    auVar129._12_4_ = (iVar58 + uVar73) * 0x200;
    auVar51._0_4_ = iVar170 + uVar74 >> 0x17;
    auVar51._4_4_ = iVar167 + uVar88 >> 0x17;
    auVar51._8_4_ = iVar45 + uVar72 >> 0x17;
    auVar51._12_4_ = iVar58 + uVar73 >> 0x17;
    auVar51 = auVar51 ^ auVar129 ^ auVar25;
    iVar168 = auVar51._0_4_;
    iVar169 = auVar51._4_4_;
    uVar21 = auVar51._8_4_ + iVar45;
    uVar30 = auVar51._12_4_ + iVar58;
    auVar130._0_4_ = (uint)(iVar168 + iVar170) >> 0x13;
    auVar130._4_4_ = (uint)(iVar169 + iVar167) >> 0x13;
    auVar130._8_4_ = uVar21 >> 0x13;
    auVar130._12_4_ = uVar30 >> 0x13;
    auVar26._0_4_ = (iVar168 + iVar170) * 0x2000;
    auVar26._4_4_ = (iVar169 + iVar167) * 0x2000;
    auVar26._8_4_ = uVar21 * 0x2000;
    auVar26._12_4_ = uVar30 * 0x2000;
    auVar27 = (auVar26 | auVar130) ^ auVar27;
    auVar131._0_12_ = auVar27._4_12_;
    auVar131._12_4_ = auVar27._0_4_;
    uVar21 = auVar27._0_4_ + iVar168;
    uVar30 = auVar27._4_4_ + iVar169;
    uVar31 = auVar27._8_4_ + auVar51._8_4_;
    uVar32 = auVar27._12_4_ + auVar51._12_4_;
    uVar74 = (uVar21 * 0x40000 | uVar21 >> 0xe) ^ uVar74;
    uVar88 = (uVar30 * 0x40000 | uVar30 >> 0xe) ^ uVar88;
    uVar72 = (uVar31 * 0x40000 | uVar31 >> 0xe) ^ uVar72;
    uVar73 = (uVar32 * 0x40000 | uVar32 >> 0xe) ^ uVar73;
    auVar52._0_8_ = auVar51._8_8_;
    auVar52._8_4_ = iVar168;
    auVar52._12_4_ = iVar169;
    auVar41._4_4_ = iVar170;
    auVar41._0_4_ = iVar58;
    auVar41._8_4_ = iVar167;
    auVar41._12_4_ = iVar45;
    auVar38._0_4_ = (iVar58 + uVar74) * 0x80;
    auVar38._4_4_ = (iVar170 + uVar88) * 0x80;
    auVar38._8_4_ = (iVar167 + uVar72) * 0x80;
    auVar38._12_4_ = (iVar45 + uVar73) * 0x80;
    auVar15._0_4_ = iVar58 + uVar74 >> 0x19;
    auVar15._4_4_ = iVar170 + uVar88 >> 0x19;
    auVar15._8_4_ = iVar167 + uVar72 >> 0x19;
    auVar15._12_4_ = iVar45 + uVar73 >> 0x19;
    auVar15 = auVar15 ^ auVar38 ^ auVar131;
    iVar170 = auVar15._0_4_;
    iVar167 = auVar15._4_4_;
    iVar45 = auVar15._8_4_;
    iVar58 = auVar15._12_4_;
    auVar39._0_4_ = (iVar170 + uVar74) * 0x200;
    auVar39._4_4_ = (iVar167 + uVar88) * 0x200;
    auVar39._8_4_ = (iVar45 + uVar72) * 0x200;
    auVar39._12_4_ = (iVar58 + uVar73) * 0x200;
    auVar132._0_4_ = iVar170 + uVar74 >> 0x17;
    auVar132._4_4_ = iVar167 + uVar88 >> 0x17;
    auVar132._8_4_ = iVar45 + uVar72 >> 0x17;
    auVar132._12_4_ = iVar58 + uVar73 >> 0x17;
    auVar132 = auVar132 ^ auVar39 ^ auVar52;
    iVar168 = auVar132._0_4_;
    iVar169 = auVar132._4_4_;
    uVar21 = auVar132._8_4_ + iVar45;
    uVar30 = auVar132._12_4_ + iVar58;
    auVar53._0_4_ = (uint)(iVar168 + iVar170) >> 0x13;
    auVar53._4_4_ = (uint)(iVar169 + iVar167) >> 0x13;
    auVar53._8_4_ = uVar21 >> 0x13;
    auVar53._12_4_ = uVar30 >> 0x13;
    auVar40._0_4_ = (iVar168 + iVar170) * 0x2000;
    auVar40._4_4_ = (iVar169 + iVar167) * 0x2000;
    auVar40._8_4_ = uVar21 * 0x2000;
    auVar40._12_4_ = uVar30 * 0x2000;
    auVar41 = (auVar40 | auVar53) ^ auVar41;
    auVar54._0_12_ = auVar41._4_12_;
    auVar54._12_4_ = auVar41._0_4_;
    uVar21 = auVar41._0_4_ + iVar168;
    uVar30 = auVar41._4_4_ + iVar169;
    uVar31 = auVar41._8_4_ + auVar132._8_4_;
    uVar32 = auVar41._12_4_ + auVar132._12_4_;
    uVar74 = (uVar21 * 0x40000 | uVar21 >> 0xe) ^ uVar74;
    uVar88 = (uVar30 * 0x40000 | uVar30 >> 0xe) ^ uVar88;
    uVar72 = (uVar31 * 0x40000 | uVar31 >> 0xe) ^ uVar72;
    uVar73 = (uVar32 * 0x40000 | uVar32 >> 0xe) ^ uVar73;
    auVar18._4_4_ = iVar170;
    auVar18._0_4_ = iVar58;
    auVar18._8_4_ = iVar167;
    auVar18._12_4_ = iVar45;
    auVar16._0_8_ = auVar132._8_8_;
    auVar16._8_4_ = iVar168;
    auVar16._12_4_ = iVar169;
    auVar133._0_4_ = (iVar58 + uVar74) * 0x80;
    auVar133._4_4_ = (iVar170 + uVar88) * 0x80;
    auVar133._8_4_ = (iVar167 + uVar72) * 0x80;
    auVar133._12_4_ = (iVar45 + uVar73) * 0x80;
    auVar28._0_4_ = iVar58 + uVar74 >> 0x19;
    auVar28._4_4_ = iVar170 + uVar88 >> 0x19;
    auVar28._8_4_ = iVar167 + uVar72 >> 0x19;
    auVar28._12_4_ = iVar45 + uVar73 >> 0x19;
    auVar28 = auVar28 ^ auVar133 ^ auVar54;
    iVar170 = auVar28._0_4_;
    iVar167 = auVar28._4_4_;
    iVar45 = auVar28._8_4_;
    iVar58 = auVar28._12_4_;
    auVar134._0_4_ = (iVar170 + uVar74) * 0x200;
    auVar134._4_4_ = (iVar167 + uVar88) * 0x200;
    auVar134._8_4_ = (iVar45 + uVar72) * 0x200;
    auVar134._12_4_ = (iVar58 + uVar73) * 0x200;
    auVar55._0_4_ = iVar170 + uVar74 >> 0x17;
    auVar55._4_4_ = iVar167 + uVar88 >> 0x17;
    auVar55._8_4_ = iVar45 + uVar72 >> 0x17;
    auVar55._12_4_ = iVar58 + uVar73 >> 0x17;
    auVar55 = auVar55 ^ auVar134 ^ auVar16;
    iVar168 = auVar55._0_4_;
    iVar169 = auVar55._4_4_;
    uVar21 = auVar55._8_4_ + iVar45;
    uVar30 = auVar55._12_4_ + iVar58;
    auVar135._0_4_ = (uint)(iVar168 + iVar170) >> 0x13;
    auVar135._4_4_ = (uint)(iVar169 + iVar167) >> 0x13;
    auVar135._8_4_ = uVar21 >> 0x13;
    auVar135._12_4_ = uVar30 >> 0x13;
    auVar17._0_4_ = (iVar168 + iVar170) * 0x2000;
    auVar17._4_4_ = (iVar169 + iVar167) * 0x2000;
    auVar17._8_4_ = uVar21 * 0x2000;
    auVar17._12_4_ = uVar30 * 0x2000;
    auVar18 = (auVar17 | auVar135) ^ auVar18;
    auVar136._0_12_ = auVar18._4_12_;
    auVar136._12_4_ = auVar18._0_4_;
    uVar21 = auVar18._0_4_ + iVar168;
    uVar30 = auVar18._4_4_ + iVar169;
    uVar31 = auVar18._8_4_ + auVar55._8_4_;
    uVar32 = auVar18._12_4_ + auVar55._12_4_;
    uVar74 = (uVar21 * 0x40000 | uVar21 >> 0xe) ^ uVar74;
    uVar88 = (uVar30 * 0x40000 | uVar30 >> 0xe) ^ uVar88;
    uVar72 = (uVar31 * 0x40000 | uVar31 >> 0xe) ^ uVar72;
    uVar73 = (uVar32 * 0x40000 | uVar32 >> 0xe) ^ uVar73;
    auVar42._0_8_ = auVar55._8_8_;
    auVar42._8_4_ = iVar168;
    auVar42._12_4_ = iVar169;
    auVar139._4_4_ = iVar170;
    auVar139._0_4_ = iVar58;
    auVar139._8_4_ = iVar167;
    auVar139._12_4_ = iVar45;
    auVar157._0_4_ = (iVar58 + uVar74) * 0x80;
    auVar157._4_4_ = (iVar170 + uVar88) * 0x80;
    auVar157._8_4_ = (iVar167 + uVar72) * 0x80;
    auVar157._12_4_ = (iVar45 + uVar73) * 0x80;
    auVar29._0_4_ = iVar58 + uVar74 >> 0x19;
    auVar29._4_4_ = iVar170 + uVar88 >> 0x19;
    auVar29._8_4_ = iVar167 + uVar72 >> 0x19;
    auVar29._12_4_ = iVar45 + uVar73 >> 0x19;
    auVar29 = auVar29 ^ auVar157 ^ auVar136;
    uVar30 = auVar29._0_4_;
    uVar31 = auVar29._4_4_;
    uVar32 = auVar29._8_4_;
    uVar21 = auVar29._12_4_;
    auVar137._0_4_ = (uVar30 + uVar74) * 0x200;
    auVar137._4_4_ = (uVar31 + uVar88) * 0x200;
    auVar137._8_4_ = (uVar32 + uVar72) * 0x200;
    auVar137._12_4_ = (uVar21 + uVar73) * 0x200;
    auVar158._0_4_ = uVar30 + uVar74 >> 0x17;
    auVar158._4_4_ = uVar31 + uVar88 >> 0x17;
    auVar158._8_4_ = uVar32 + uVar72 >> 0x17;
    auVar158._12_4_ = uVar21 + uVar73 >> 0x17;
    auVar158 = auVar158 ^ auVar137 ^ auVar42;
    iVar168 = auVar158._0_4_;
    iVar169 = auVar158._4_4_;
    uVar87 = auVar158._8_4_ + uVar32;
    uVar89 = auVar158._12_4_ + uVar21;
    auVar43._0_4_ = iVar168 + uVar30 >> 0x13;
    auVar43._4_4_ = iVar169 + uVar31 >> 0x13;
    auVar43._8_4_ = uVar87 >> 0x13;
    auVar43._12_4_ = uVar89 >> 0x13;
    auVar138._0_4_ = (iVar168 + uVar30) * 0x2000;
    auVar138._4_4_ = (iVar169 + uVar31) * 0x2000;
    auVar138._8_4_ = uVar87 * 0x2000;
    auVar138._12_4_ = uVar89 * 0x2000;
    auVar139 = (auVar138 | auVar43) ^ auVar139;
    auVar56._0_12_ = auVar139._4_12_;
    auVar56._12_4_ = auVar139._0_4_;
    uVar87 = auVar139._0_4_ + iVar168;
    uVar89 = auVar139._4_4_ + iVar169;
    uVar140 = auVar139._8_4_ + auVar158._8_4_;
    uVar141 = auVar139._12_4_ + auVar158._12_4_;
    auVar159._0_8_ = auVar158._8_8_;
    auVar159._8_4_ = iVar168;
    auVar159._12_4_ = iVar169;
    uVar74 = (uVar87 * 0x40000 | uVar87 >> 0xe) ^ uVar74;
    uVar88 = (uVar89 * 0x40000 | uVar89 >> 0xe) ^ uVar88;
    uVar72 = (uVar140 * 0x40000 | uVar140 >> 0xe) ^ uVar72;
    uVar73 = (uVar141 * 0x40000 | uVar141 >> 0xe) ^ uVar73;
    auVar19._0_4_ = (uVar21 + uVar74) * 0x80;
    auVar19._4_4_ = (uVar30 + uVar88) * 0x80;
    auVar19._8_4_ = (uVar31 + uVar72) * 0x80;
    auVar19._12_4_ = (uVar32 + uVar73) * 0x80;
    auVar44._0_4_ = uVar21 + uVar74 >> 0x19;
    auVar44._4_4_ = uVar30 + uVar88 >> 0x19;
    auVar44._8_4_ = uVar31 + uVar72 >> 0x19;
    auVar44._12_4_ = uVar32 + uVar73 >> 0x19;
    auVar44 = auVar44 ^ auVar19 ^ auVar56;
    iVar45 = auVar44._0_4_;
    iVar58 = auVar44._4_4_;
    iVar59 = auVar44._8_4_;
    iVar60 = auVar44._12_4_;
    auVar20._0_4_ = (iVar45 + uVar74) * 0x200;
    auVar20._4_4_ = (iVar58 + uVar88) * 0x200;
    auVar20._8_4_ = (iVar59 + uVar72) * 0x200;
    auVar20._12_4_ = (iVar60 + uVar73) * 0x200;
    auVar57._0_4_ = iVar45 + uVar74 >> 0x17;
    auVar57._4_4_ = iVar58 + uVar88 >> 0x17;
    auVar57._8_4_ = iVar59 + uVar72 >> 0x17;
    auVar57._12_4_ = iVar60 + uVar73 >> 0x17;
    auVar57 = auVar57 ^ auVar20 ^ auVar159;
    iVar168 = auVar57._0_4_;
    iVar169 = auVar57._4_4_;
    iVar170 = auVar57._8_4_;
    iVar167 = auVar57._12_4_;
    uVar21 = ((iVar168 + iVar45) * 0x2000 | (uint)(iVar168 + iVar45) >> 0x13) ^ uVar21;
    uVar30 = ((iVar169 + iVar58) * 0x2000 | (uint)(iVar169 + iVar58) >> 0x13) ^ uVar30;
    uVar31 = ((iVar170 + iVar59) * 0x2000 | (uint)(iVar170 + iVar59) >> 0x13) ^ uVar31;
    uVar32 = ((iVar167 + iVar60) * 0x2000 | (uint)(iVar167 + iVar60) >> 0x13) ^ uVar32;
    uVar87 = uVar21 + iVar168;
    uVar89 = uVar30 + iVar169;
    uVar140 = uVar31 + iVar170;
    uVar141 = uVar32 + iVar167;
    uVar163 = ((uVar87 * 0x40000 | uVar87 >> 0xe) ^ uVar74) + uVar163;
    uVar164 = ((uVar89 * 0x40000 | uVar89 >> 0xe) ^ uVar88) + uVar164;
    uVar165 = ((uVar140 * 0x40000 | uVar140 >> 0xe) ^ uVar72) + uVar165;
    uVar166 = ((uVar141 * 0x40000 | uVar141 >> 0xe) ^ uVar73) + uVar166;
    puVar6 = (uint32_t *)((long)Bout + lVar9 + r * 0x40 + -0x30);
    *puVar6 = uVar163;
    puVar6[1] = uVar164;
    puVar6[2] = uVar165;
    puVar6[3] = uVar166;
    uVar30 = uVar30 + uVar142;
    uVar31 = uVar31 + uVar160;
    uVar32 = uVar32 + uVar161;
    uVar21 = uVar21 + uVar162;
    puVar2 = (uint *)((long)Bout + lVar9 + r * 0x40 + -0x20);
    *puVar2 = uVar30;
    puVar2[1] = uVar31;
    puVar2[2] = uVar32;
    puVar2[3] = uVar21;
    auVar46._0_4_ = iVar170 + auVar86._0_4_;
    auVar46._4_4_ = iVar167 + auVar86._4_4_;
    auVar46._8_4_ = iVar168 + auVar86._8_4_;
    auVar46._12_4_ = iVar169 + auVar86._12_4_;
    *(undefined1 (*) [16])((long)Bout + lVar9 + r * 0x40 + -0x10) = auVar46;
    auVar33._0_4_ = iVar60 + auVar63._0_4_;
    auVar33._4_4_ = iVar45 + auVar63._4_4_;
    auVar33._8_4_ = iVar58 + auVar63._8_4_;
    auVar33._12_4_ = iVar59 + auVar63._12_4_;
    *(undefined1 (*) [16])((long)Bout + lVar9 + r * 0x40) = auVar33;
    lVar9 = lVar9 + 0x40;
    lVar10 = lVar10 + -1;
  } while (lVar10 != 0);
  return uVar163;
}

Assistant:

static uint32_t
blockmix_salsa8_xor(const salsa20_blk_t *restrict Bin1,
    const salsa20_blk_t *restrict Bin2, salsa20_blk_t *restrict Bout,
    size_t r)
{
	size_t i;
	__m128i X0, X1, X2, X3;

	r--;
	PREFETCH(&Bin2[r * 2 + 1], _MM_HINT_T0)
	PREFETCH(&Bin1[r * 2 + 1], _MM_HINT_T0)
	for (i = 0; i < r; i++) {
		PREFETCH(&Bin2[i * 2], _MM_HINT_T0)
		PREFETCH(&Bin1[i * 2], _MM_HINT_T0)
		PREFETCH(&Bin2[i * 2 + 1], _MM_HINT_T0)
		PREFETCH(&Bin1[i * 2 + 1], _MM_HINT_T0)
	}
	PREFETCH(&Bin2[r * 2], _MM_HINT_T0)
	PREFETCH(&Bin1[r * 2], _MM_HINT_T0)

	/* 1: X <-- B_{2r - 1} */
	XOR4_2(Bin1[r * 2 + 1].q, Bin2[r * 2 + 1].q)

	/* 2: for i = 0 to 2r - 1 do */
	for (i = 0; i <= r; i++) {
		/* 3: X <-- H(X \xor B_i) */
		/* 4: Y_i <-- X */
		/* 6: B' <-- (Y_0, Y_2 ... Y_{2r-2}, Y_1, Y_3 ... Y_{2r-1}) */
		XOR4(Bin1[i * 2].q)
		SALSA20_8_XOR_MEM(Bin2[i * 2].q, Bout[i].q)

		/* 3: X <-- H(X \xor B_i) */
		/* 4: Y_i <-- X */
		/* 6: B' <-- (Y_0, Y_2 ... Y_{2r-2}, Y_1, Y_3 ... Y_{2r-1}) */
		XOR4(Bin1[i * 2 + 1].q)
		SALSA20_8_XOR_MEM(Bin2[i * 2 + 1].q, Bout[r + 1 + i].q)
	}

	return _mm_cvtsi128_si32(X0);
}